

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O0

ACT_TYPE despot::POMCP::UpperBoundAction(VNode *vnode,double explore_constant)

{
  int iVar1;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *this;
  size_type sVar2;
  const_reference ppQVar3;
  double dVar4;
  __type _Var5;
  double dVar6;
  double ub;
  ACT_TYPE action;
  ACT_TYPE best_action;
  double best_ub;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *qnodes;
  double explore_constant_local;
  VNode *vnode_local;
  
  this = VNode::children(vnode);
  _action = -INFINITY;
  ub._4_4_ = -1;
  ub._0_4_ = 0;
  while( true ) {
    sVar2 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::size(this);
    if (sVar2 <= (ulong)(long)ub._0_4_) {
      if (ub._4_4_ != -1) {
        return ub._4_4_;
      }
      __assert_fail("best_action != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/solver/pomcp.cpp"
                    ,0xc3,"static ACT_TYPE despot::POMCP::UpperBoundAction(const VNode *, double)");
    }
    ppQVar3 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::operator[]
                        (this,(long)ub._0_4_);
    iVar1 = QNode::count(*ppQVar3);
    if (iVar1 == 0) break;
    ppQVar3 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::operator[]
                        (this,(long)ub._0_4_);
    dVar4 = QNode::value(*ppQVar3);
    iVar1 = VNode::count(vnode);
    _Var5 = std::log<int>(iVar1 + 1);
    ppQVar3 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::operator[]
                        (this,(long)ub._0_4_);
    iVar1 = QNode::count(*ppQVar3);
    dVar6 = sqrt(_Var5 / (double)iVar1);
    dVar4 = explore_constant * dVar6 + dVar4;
    if (_action < dVar4) {
      ub._4_4_ = ub._0_4_;
      _action = dVar4;
    }
    ub._0_4_ = ub._0_4_ + 1;
  }
  return ub._0_4_;
}

Assistant:

ACT_TYPE POMCP::UpperBoundAction(const VNode* vnode, double explore_constant) {
	const vector<QNode*>& qnodes = vnode->children();
	double best_ub = Globals::NEG_INFTY;
	ACT_TYPE best_action = -1;

	/*
	 int total = 0;
	 for (ACT_TYPE action = 0; action < qnodes.size(); action ++) {
	 total += qnodes[action]->count();
	 double ub = qnodes[action]->value() + explore_constant * sqrt(log(vnode->count() + 1) / qnodes[action]->count());
	 cout << action << " " << ub << " " << qnodes[action]->value() << " " << qnodes[action]->count() << " " << vnode->count() << endl;
	 }
	 */

	for (ACT_TYPE action = 0; action < qnodes.size(); action++) {
		if (qnodes[action]->count() == 0)
			return action;

		double ub = qnodes[action]->value()
			+ explore_constant
				* sqrt(log(vnode->count() + 1) / qnodes[action]->count());

		if (ub > best_ub) {
			best_ub = ub;
			best_action = action;
		}
	}

	assert(best_action != -1);
	return best_action;
}